

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

void Fossilize::
     serialize_application_info_inline<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (Value *value,VkApplicationInfo *info,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc)

{
  char *pcVar1;
  Data local_98;
  Data local_88;
  GenericStringRef<char> local_70;
  StringRefType local_60;
  GenericStringRef<char> local_50;
  StringRefType local_40;
  
  pcVar1 = info->pApplicationName;
  if (pcVar1 != (char *)0x0) {
    local_40.s = "applicationName";
    local_40.length = 0xf;
    local_50.s = pcVar1;
    local_50.length = rapidjson::GenericStringRef<char>::NotNullStrLen(&local_50,pcVar1);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(value,&local_40,&local_50,alloc);
  }
  pcVar1 = info->pEngineName;
  if (pcVar1 != (char *)0x0) {
    local_60.s = "engineName";
    local_60.length = 10;
    local_70.s = pcVar1;
    local_70.length = rapidjson::GenericStringRef<char>::NotNullStrLen(&local_70,pcVar1);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(value,&local_60,&local_70,alloc);
  }
  local_88._4_1_ = '\0';
  local_88._5_1_ = '\0';
  local_88._6_1_ = '\0';
  local_88._7_1_ = '\0';
  local_88._0_4_ = info->applicationVersion;
  local_98.s.str = (Ch *)0x405000000151e41;
  local_98.n = (Number)0x12;
  local_88.s.str = (Ch *)((ulong)(-1 < (int)info->applicationVersion) << 0x35 | 0x1d6000000000000);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(value,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_98.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_88.s,alloc);
  local_88._4_1_ = '\0';
  local_88._5_1_ = '\0';
  local_88._6_1_ = '\0';
  local_88._7_1_ = '\0';
  local_88._0_4_ = info->engineVersion;
  local_98.s.str = (Ch *)0x405000000151e54;
  local_98.n = (Number)0xd;
  local_88.s.str = (Ch *)((ulong)(-1 < (int)info->engineVersion) << 0x35 | 0x1d6000000000000);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(value,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_98.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_88.s,alloc);
  local_88._4_1_ = '\0';
  local_88._5_1_ = '\0';
  local_88._6_1_ = '\0';
  local_88._7_1_ = '\0';
  local_88._0_4_ = info->apiVersion;
  local_98.s.str = (Ch *)0x405000000151e23;
  local_98.n = (Number)0xa;
  local_88.s.str = (Ch *)((ulong)(-1 < (int)info->apiVersion) << 0x35 | 0x1d6000000000000);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(value,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_98.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_88.s,alloc);
  return;
}

Assistant:

static void serialize_application_info_inline(Value &value, const VkApplicationInfo &info, AllocType &alloc)
{
	if (info.pApplicationName)
		value.AddMember("applicationName", StringRef(info.pApplicationName), alloc);
	if (info.pEngineName)
		value.AddMember("engineName", StringRef(info.pEngineName), alloc);
	value.AddMember("applicationVersion", info.applicationVersion, alloc);
	value.AddMember("engineVersion", info.engineVersion, alloc);
	value.AddMember("apiVersion", info.apiVersion, alloc);
}